

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O2

bool __thiscall GGSock::FileServer::update(FileServer *this)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  _Elt_pointer __rhs;
  Communicator *this_00;
  bool bVar4;
  bool bVar5;
  char cVar6;
  reference pvVar7;
  size_type sVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var12;
  int iVar13;
  undefined8 uVar14;
  long lVar15;
  size_type __n;
  char cVar16;
  pthread_mutex_t *ppVar17;
  long lVar18;
  reference rVar19;
  SerializationBuffer buffer;
  Serialize local_88;
  FileChunkResponseData fileChunkToSend;
  
  FileChunkResponseData::FileChunkResponseData(&fileChunkToSend);
  ppVar17 = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  std::mutex::lock((mutex *)&ppVar17->__data);
  _Var12._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  if ((_Var12._M_head_impl)->changedFileInfos == true) {
    Impl::updateFileInfos(_Var12._M_head_impl);
    _Var12._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
    (_Var12._M_head_impl)->changedFileInfos = false;
  }
  if ((_Var12._M_head_impl)->changedClientInfos == true) {
    Impl::updateClientInfos(_Var12._M_head_impl);
    _Var12._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
    (_Var12._M_head_impl)->changedClientInfos = false;
  }
  uVar3 = (_Var12._M_head_impl)->currentClientUpdateId;
  __n = (size_type)(int)uVar3;
  (_Var12._M_head_impl)->currentClientUpdateId = uVar3 + 1;
  uVar14 = 0xa8;
  if (uVar3 + 1 ==
      (int)(((long)*(pointer *)
                    ((long)&((_Var12._M_head_impl)->clients).
                            super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>
                            ._M_impl + 8) -
            *(long *)&((_Var12._M_head_impl)->clients).
                      super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>.
                      _M_impl.super__Vector_impl_data) / 0xa8)) {
    (_Var12._M_head_impl)->currentClientUpdateId = 0;
  }
  pvVar7 = std::vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>::at
                     (&(_Var12._M_head_impl)->clients,__n);
  iVar13 = (int)uVar14;
  bVar1 = pvVar7->isUpdating;
  if (bVar1 == false) {
    cVar2 = ((this->m_impl)._M_t.
             super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
             .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->isListening;
    cVar16 = pvVar7->sendFileInfos;
    pvVar7->sendFileInfos = false;
    sVar8 = std::
            deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
            ::size(&pvVar7->fileChunkRequests);
    iVar13 = (int)uVar14;
    if (sVar8 == 0) {
      bVar4 = false;
    }
    else {
      __rhs = (pvVar7->fileChunkRequests).
              super__Deque_base<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
      std::__cxx11::string::_M_assign((string *)&fileChunkToSend);
      fileChunkToSend.chunkId = __rhs->chunkId;
      lVar18 = 0;
      sVar8 = 0;
      while( true ) {
        iVar13 = (int)uVar14;
        _Var12._M_head_impl =
             (this->m_impl)._M_t.
             super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
             .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
        lVar9 = (long)(int)(((long)*(pointer *)((long)&(_Var12._M_head_impl)->files + 8) -
                            *(long *)&((_Var12._M_head_impl)->files).
                                      super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                            ) / 0x68);
        bVar4 = (long)sVar8 < lVar9;
        if (lVar9 <= (long)sVar8) break;
        rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&(_Var12._M_head_impl)->fileUsed,sVar8);
        if ((*rVar19._M_p & rVar19._M_mask) != 0) {
          lVar9 = *(long *)&(((this->m_impl)._M_t.
                              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl
                             )->files).
                            super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
          ;
          bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(lVar9 + lVar18),&__rhs->uri);
          if (!bVar5) {
            lVar15 = *(long *)(lVar9 + 0x50 + lVar18);
            uVar11 = *(long *)(lVar9 + 0x58 + lVar18) - lVar15;
            iVar13 = *(int *)(lVar9 + 0x48 + lVar18);
            uVar10 = uVar11 / (ulong)(long)iVar13;
            fileChunkToSend.pStart = (long)__rhs->chunkId * uVar10;
            fileChunkToSend.pLen = uVar11 - fileChunkToSend.pStart;
            if (__rhs->chunkId != iVar13 + -1) {
              fileChunkToSend.pLen = uVar10;
            }
            std::vector<char,std::allocator<char>>::
            _M_assign_aux<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                      ((vector<char,std::allocator<char>> *)&fileChunkToSend.data,
                       fileChunkToSend.pStart + lVar15,
                       fileChunkToSend.pLen + fileChunkToSend.pStart + lVar15);
            iVar13 = (int)lVar15;
            break;
          }
        }
        sVar8 = sVar8 + 1;
        lVar18 = lVar18 + 0x68;
      }
      std::
      deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
      ::pop_front(&pvVar7->fileChunkRequests);
    }
    pvVar7->isUpdating = true;
    cVar6 = pvVar7->wasConnected;
    if ((bool)cVar6 == true) {
      bVar5 = Communicator::isConnected
                        ((pvVar7->communicator).
                         super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        );
      if (!bVar5) {
        printf("Client %d has disconnected\n",(ulong)uVar3);
        pvVar7->wasConnected = false;
        Impl::updateClientInfos
                  ((this->m_impl)._M_t.
                   super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                   .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl);
      }
      cVar6 = pvVar7->wasConnected;
    }
    if (cVar6 == '\0') {
      bVar5 = Communicator::isConnected
                        ((pvVar7->communicator).
                         super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        );
      if (bVar5) {
        printf("Client %d has connected\n",(ulong)uVar3);
        pvVar7->wasConnected = true;
        Communicator::getPeerAddress_abi_cxx11_
                  ((TAddress *)&buffer,
                   (pvVar7->communicator).
                   super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::operator=((string *)&(pvVar7->info).address,(string *)&buffer);
        std::__cxx11::string::~string((string *)&buffer);
        Impl::updateClientInfos
                  ((this->m_impl)._M_t.
                   super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                   .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl);
      }
    }
  }
  else {
    bVar4 = false;
    cVar16 = '\0';
    cVar2 = '\0';
  }
  pthread_mutex_unlock(ppVar17);
  if (bVar1 == false) {
    pvVar7 = std::vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>::at
                       (&((this->m_impl)._M_t.
                          super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                          .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->
                         clients,__n);
    this_00 = (pvVar7->communicator).
              super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (cVar2 == '\0') {
      Communicator::stopListening(this_00);
    }
    else {
      Communicator::listen
                (this_00,*(TPort *)((long)&((this->m_impl)._M_t.
                                            super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                                            .
                                            super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>
                                           ._M_head_impl)->parameters + 0x10),0);
    }
    if (cVar16 != '\0') {
      buffer.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_88.nBytesProcessed = 0;
      buffer.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      buffer.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      Serialize::operator()
                (&local_88,
                 &((this->m_impl)._M_t.
                   super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                   .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->
                  fileInfos,&buffer);
      Communicator::send((pvVar7->communicator).
                         super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         ,0x65,buffer.super_vector<char,_std::allocator<char>_>.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start,
                         (ulong)(uint)((int)buffer.super_vector<char,_std::allocator<char>_>.
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                      (int)buffer.super_vector<char,_std::allocator<char>_>.
                                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                           super__Vector_impl_data._M_start),iVar13);
      Communicator::update
                ((pvVar7->communicator).
                 super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&buffer);
    }
    if (bVar4) {
      buffer.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      buffer.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      buffer.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_88.nBytesProcessed = 0;
      Serialize::operator()(&local_88,&fileChunkToSend,&buffer);
      Communicator::send((pvVar7->communicator).
                         super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         ,0x67,buffer.super_vector<char,_std::allocator<char>_>.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start,
                         (ulong)(uint)((int)buffer.super_vector<char,_std::allocator<char>_>.
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                      (int)buffer.super_vector<char,_std::allocator<char>_>.
                                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                           super__Vector_impl_data._M_start),iVar13);
      Communicator::update
                ((pvVar7->communicator).
                 super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&buffer);
    }
    Communicator::update
              ((pvVar7->communicator).
               super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    ppVar17 = (pthread_mutex_t *)
              &((this->m_impl)._M_t.
                super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
    std::mutex::lock((mutex *)&ppVar17->__data);
    *(undefined1 *)
     (*(long *)&(((this->m_impl)._M_t.
                  super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                  .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->clients).
                super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_> + 0x40 +
     __n * 0xa8) = 0;
    pthread_mutex_unlock(ppVar17);
  }
  FileChunkResponseData::~FileChunkResponseData(&fileChunkToSend);
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool FileServer::update() {
    bool doListen = false;
    bool doSendFileInfos = false;
    bool doSendFileChunk = false;

    FileChunkResponseData fileChunkToSend;

    TClientId updateId = -1;

    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        if (m_impl->changedFileInfos) {
            m_impl->updateFileInfos();
            m_impl->changedFileInfos = false;
        }

        if (m_impl->changedClientInfos) {
            m_impl->updateClientInfos();
            m_impl->changedClientInfos = false;
        }

        updateId = m_impl->currentClientUpdateId;

        if (++m_impl->currentClientUpdateId == (int) m_impl->clients.size()) {
            m_impl->currentClientUpdateId = 0;
        }

        auto & client = m_impl->clients.at(updateId);

        if (client.isUpdating) {
            return false;
        }

        doListen = m_impl->isListening;

        doSendFileInfos = client.sendFileInfos;
        client.sendFileInfos = false;

        if (client.fileChunkRequests.size() > 0) {
            const auto & req = client.fileChunkRequests.front();

            // todo : data checks
            fileChunkToSend.uri = req.uri;
            fileChunkToSend.chunkId = req.chunkId;
            for (int i = 0; i < (int) m_impl->files.size(); ++i) {
                if (m_impl->fileUsed[i] == false) {
                    continue;
                }

                const auto & file = m_impl->files[i];
                if (file.info.uri != req.uri) {
                    continue;
                }

                auto chunkSize = file.data.size()/file.info.nChunks;

                int64_t pStart = req.chunkId*chunkSize;
                int64_t pLen = req.chunkId == (file.info.nChunks - 1) ? file.data.size() - pStart : chunkSize;

                fileChunkToSend.pStart = pStart;
                fileChunkToSend.pLen = pLen;
                fileChunkToSend.data.assign(file.data.begin() + pStart, file.data.begin() + pStart + pLen);

                doSendFileChunk = true;

                break;
            }

            client.fileChunkRequests.pop_front();
        }

        client.isUpdating = true;

        if (client.wasConnected && client.communicator->isConnected() == false) {
            printf("Client %d has disconnected\n", updateId);
            client.wasConnected = false;
            m_impl->updateClientInfos();
        }

        if (client.wasConnected == false && client.communicator->isConnected()) {
            printf("Client %d has connected\n", updateId);
            client.wasConnected = true;
            client.info.address = client.communicator->getPeerAddress();
            m_impl->updateClientInfos();
        }
    }

    {
        auto & client = m_impl->clients.at(updateId);
        if (doListen) {
            client.communicator->listen(m_impl->parameters.listenPort, 0);
        } else {
            client.communicator->stopListening();
        }
        if (doSendFileInfos) {
            SerializationBuffer buffer;
            Serialize()(m_impl->fileInfos, buffer);
            client.communicator->send(MsgFileInfosResponse, buffer.data(), (int) buffer.size());
            client.communicator->update();
        }
        if (doSendFileChunk) {
            SerializationBuffer buffer;
            Serialize()(fileChunkToSend, buffer);
            client.communicator->send(MsgFileChunkResponse, buffer.data(), (int) buffer.size());
            client.communicator->update();
        }
        client.communicator->update();
    }

    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);
        m_impl->clients[updateId].isUpdating = false;
    }

    return true;
}